

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_globals.cpp
# Opt level: O0

GOs __thiscall
Omega_h::rescan_globals<signed_char>(Omega_h *this,Mesh *mesh,Read<signed_char> *counts)

{
  char *file;
  element_type *this_00;
  void *pvVar1;
  void *extraout_RDX;
  GOs GVar2;
  Write<long> local_1d0;
  undefined1 local_1c0 [8];
  type f;
  string local_190 [32];
  undefined1 local_170 [8];
  Write<long> new_globals_w;
  long start;
  int nnew;
  Read<signed_char> local_120;
  undefined1 local_110 [8];
  LOs local_offsets;
  allocator local_c9;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [39];
  ScopedTimer local_61;
  Read<signed_char> *pRStack_60;
  ScopedTimer omega_h_scoped_function_timer;
  Read<signed_char> *counts_local;
  Mesh *mesh_local;
  LO local_20;
  LO local_10;
  
  pRStack_60 = counts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_globals.cpp"
             ,&local_c9);
  std::operator+(local_a8,(char *)local_c8);
  std::__cxx11::to_string((__cxx11 *)&local_offsets.write_.shared_alloc_.direct_ptr,10);
  std::operator+(local_88,local_a8);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_61,"rescan_globals",file);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_offsets.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  Read<signed_char>::Read(&local_120,counts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&nnew,"",(allocator *)((long)&start + 7));
  offset_scan<signed_char>((Omega_h *)local_110,&local_120,(string *)&nnew);
  std::__cxx11::string::~string((string *)&nnew);
  std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
  Read<signed_char>::~Read(&local_120);
  start._0_4_ = Read<int>::last((Read<int> *)local_110);
  Mesh::comm((Mesh *)&new_globals_w.shared_alloc_.direct_ptr);
  this_00 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&new_globals_w.shared_alloc_.direct_ptr);
  pvVar1 = (void *)Comm::exscan<long>(this_00,(long)(int)start,OMEGA_H_SUM);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr
            ((shared_ptr<Omega_h::Comm> *)&new_globals_w.shared_alloc_.direct_ptr);
  if (((ulong)(counts->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (LO)((counts->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (LO)((ulong)(counts->write_).shared_alloc_.alloc >> 3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"",(allocator *)((long)&f.start + 7));
  Write<long>::Write((Write<long> *)local_170,local_10,(string *)local_190);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.start + 7));
  Write<long>::Write((Write<long> *)local_1c0,(Write<int> *)local_170);
  Read<int>::Read((Read<int> *)&f.new_globals_w.shared_alloc_.direct_ptr,(Read<int> *)local_110);
  if (((ulong)(counts->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = (LO)((counts->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (LO)((ulong)(counts->write_).shared_alloc_.alloc >> 3);
  }
  f.local_offsets.write_.shared_alloc_.direct_ptr = pvVar1;
  parallel_for<Omega_h::rescan_globals<signed_char>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::_lambda(int)_1_>
            (local_20,(type *)local_1c0);
  Write<long>::Write(&local_1d0,(Write<int> *)local_170);
  Read<long>::Read((Read<long> *)this,&local_1d0);
  Write<long>::~Write(&local_1d0);
  rescan_globals<signed_char>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)local_1c0);
  Write<long>::~Write((Write<long> *)local_170);
  Read<int>::~Read((Read<int> *)local_110);
  ScopedTimer::~ScopedTimer(&local_61);
  GVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  GVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (GOs)GVar2.write_.shared_alloc_;
}

Assistant:

GOs rescan_globals(Mesh* mesh, Read<T> counts) {
  OMEGA_H_TIME_FUNCTION;
  auto const local_offsets = offset_scan(counts);
  auto const nnew = local_offsets.last();
  auto const start = mesh->comm()->exscan(GO(nnew), OMEGA_H_SUM);
  auto const new_globals_w = Write<GO>(counts.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    new_globals_w[i] = local_offsets[i] + start;
  };
  parallel_for(counts.size(), std::move(f));
  return new_globals_w;
}